

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpSocket.cpp
# Opt level: O3

int __thiscall TcpSocket::connect(TcpSocket *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  uint uVar1;
  undefined1 local_18 [8];
  sockaddr_in saddr;
  ulong uVar2;
  
  local_18._0_2_ = 2;
  local_18._4_4_ =
       (uint)__fd >> 0x18 | (__fd & 0xff0000U) >> 8 | (__fd & 0xff00U) << 8 | __fd << 0x18;
  local_18._2_2_ = (ushort)__addr << 8 | (ushort)__addr >> 8;
  uVar1 = ::connect((this->super_Socket)._fd,(sockaddr *)local_18,0x10);
  uVar2 = (ulong)uVar1;
  if (uVar1 == 0xffffffff) {
    uVar1 = Socket::lastErr();
    uVar2 = (ulong)uVar1;
    if (uVar1 != 0x73) {
      uVar1 = Socket::lastErr();
      uVar2 = (ulong)uVar1;
      if (uVar1 != 0xb) {
        return 0;
      }
    }
  }
  return (int)CONCAT71((int7)(uVar2 >> 8),1);
}

Assistant:

bool TcpSocket::connect( uint32_t ipaddr, uint16_t port )
{
    struct sockaddr_in saddr;
    saddr.sin_family = AF_INET;
    saddr.sin_addr.s_addr = htonl(ipaddr);
    saddr.sin_port = htons(port);
    if(::connect(_fd, (const struct sockaddr *)&saddr, sizeof(saddr)) == SOCKET_ERROR && (lastErr() != EINPROGRESS && lastErr() != EWOULDBLOCK))
        return false;
    return true;
}